

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::readSampleCountForLineBlock
               (InputStreamMutex *streamData,Data *data,int lineBlockId)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  ArgExc *pAVar6;
  int *piVar7;
  ostream *poVar8;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  bool *pbVar12;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  int count;
  int accumulatedCount;
  int x;
  int lastAccumulatedCount;
  int yInDataWindow;
  int y;
  size_t cumulative_total_samples;
  int yStride;
  int xStride;
  char *base;
  stringstream _iex_throw_s_2;
  char *readPtr;
  stringstream _iex_throw_s_1;
  int compressorMaxDataSize;
  Int64 unpackedDataSize;
  Int64 packedDataSize;
  stringstream _iex_throw_s;
  Int64 sampleCountTableDataSize;
  int maxY;
  int minY;
  int partNumber;
  unsigned_long *in_stack_fffffffffffff6c8;
  IStream *in_stack_fffffffffffff6d0;
  stringstream local_838 [16];
  ostream local_828 [376];
  stringstream local_6b0 [16];
  ostream local_6a0 [376];
  uint local_528;
  int local_524;
  int local_520;
  int local_51c;
  int local_518;
  int local_514;
  long local_510;
  int local_508;
  int local_504;
  char *local_500;
  stringstream local_4f8 [16];
  ostream local_4e8 [376];
  char *local_370;
  stringstream local_368 [16];
  ostream local_358 [380];
  int local_1dc;
  ulong local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  ulong local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xe8),
                      (long)in_EDX);
  (**(code **)(*plVar1 + 0x30))(plVar1,*pvVar5);
  bVar3 = isMultiPart(*(int *)(local_10 + 0x60));
  if ((bVar3) &&
     (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8),
     local_18 != *(int *)(local_10 + 0x16c))) {
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar6,"Unexpected part number.");
    __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8);
  if (local_1c != *(int *)(local_10 + 0xdc) + local_14 * *(int *)(local_10 + 0x168)) {
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar6,"Unexpected data block y coordinate.");
    __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_24 = local_1c + *(int *)(local_10 + 0x168) + -1;
  piVar7 = std::min<int>(&local_24,(int *)(local_10 + 0xe0));
  local_20 = *piVar7;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8)
  ;
  if (local_30 <= (ulong)(long)*(int *)(local_10 + 500)) {
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    local_1dc = std::numeric_limits<int>::max();
    if ((ulong)(long)local_1dc < local_30) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_368);
      poVar8 = std::operator<<(local_358,"This version of the library does not ");
      poVar8 = std::operator<<(poVar8,"support the allocation of data with size  > ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1dc);
      poVar8 = std::operator<<(poVar8," file table size    :");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_30);
      std::operator<<(poVar8,".\n");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar6,local_368);
      __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    plVar1 = *(long **)(local_8 + 0x28);
    pcVar9 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
    (**(code **)(*plVar1 + 0x18))(plVar1,pcVar9,local_30 & 0xffffffff);
    if (local_30 < (ulong)(long)*(int *)(local_10 + 500)) {
      if (*(long *)(local_10 + 0x1e8) == 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_4f8);
        poVar8 = std::operator<<(local_4e8,"Deep scanline data corrupt at chunk ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_14);
        std::operator<<(poVar8," (sampleCountTableDataSize error)");
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar6,local_4f8);
        __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      plVar1 = *(long **)(local_10 + 0x1e8);
      pcVar9 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
      (**(code **)(*plVar1 + 0x30))(plVar1,pcVar9,local_30 & 0xffffffff,local_1c,&local_370);
    }
    else {
      local_370 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
    }
    local_500 = *(char **)(local_10 + 0x1c0);
    local_504 = *(int *)(local_10 + 0x1c8);
    local_508 = *(int *)(local_10 + 0x1cc);
    local_510 = 0;
    local_514 = local_1c;
    while( true ) {
      if (local_20 < local_514) {
        return;
      }
      local_518 = local_514 - *(int *)(local_10 + 0xdc);
      puVar10 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
      puVar10[local_518] = 0;
      local_51c = 0;
      for (local_520 = *(int *)(local_10 + 0xd4); local_520 <= *(int *)(local_10 + 0xd8);
          local_520 = local_520 + 1) {
        Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                  ((char **)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8);
        if (local_524 < local_51c) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_6b0);
          poVar8 = std::operator<<(local_6a0,"Deep scanline sampleCount data corrupt at chunk ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_14);
          std::operator<<(poVar8," (negative sample count detected)");
          pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar6,local_6b0);
          __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        uVar4 = local_524 - local_51c;
        local_51c = local_524;
        local_528 = uVar4;
        puVar10 = Array2D<unsigned_int>::operator[]
                            ((Array2D<unsigned_int> *)(local_10 + 0x188),(long)local_518);
        uVar2 = local_528;
        puVar10[local_520 - *(int *)(local_10 + 0xd4)] = uVar4;
        puVar10 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
        uVar4 = local_528;
        puVar10[local_518] = uVar2 + puVar10[local_518];
        puVar10 = (uint *)sampleCount(local_500,local_504,local_508,local_520,local_514);
        *puVar10 = uVar4;
      }
      puVar10 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
      local_510 = (ulong)puVar10[local_518] + local_510;
      uVar11 = local_510 * *(int *)(local_10 + 0x1f0);
      if (local_1d8 <= uVar11 && uVar11 - local_1d8 != 0) break;
      pbVar12 = Array::operator_cast_to_bool_((Array *)(local_10 + 0x1b0));
      pbVar12[local_514 - *(int *)(local_10 + 0xdc)] = true;
      local_514 = local_514 + 1;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_838);
    poVar8 = std::operator<<(local_828,"Deep scanline sampleCount data corrupt at chunk ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_14);
    poVar8 = std::operator<<(poVar8,": pixel data only contains ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1d8);
    poVar8 = std::operator<<(poVar8," bytes of data but table references at least ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_510 * *(int *)(local_10 + 0x1f0));
    std::operator<<(poVar8," bytes of sample data");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar6,local_838);
    __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar8 = std::operator<<(local_1a8,"Bad sampleCountTableDataSize read from chunk ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_14);
  poVar8 = std::operator<<(poVar8,": expected ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)(local_10 + 500));
  poVar8 = std::operator<<(poVar8," or less, got ");
  std::ostream::operator<<(poVar8,local_30);
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar6,local_1b8);
  __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
readSampleCountForLineBlock(InputStreamMutex* streamData,
                            DeepScanLineInputFile::Data* data,
                            int lineBlockId)
{
    streamData->is->seekg(data->lineOffsets[lineBlockId]);

    if (isMultiPart(data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, partNumber);

        if (partNumber != data->partNumber)
            throw IEX_NAMESPACE::ArgExc("Unexpected part number.");
    }

    int minY;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, minY);

    //
    // Check the correctness of minY.
    //

    if (minY != data->minY + lineBlockId * data->linesInBuffer)
        throw IEX_NAMESPACE::ArgExc("Unexpected data block y coordinate.");

    int maxY;
    maxY = min(minY + data->linesInBuffer - 1, data->maxY);

    Int64 sampleCountTableDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, sampleCountTableDataSize);

    
    
    if(sampleCountTableDataSize>static_cast<Int64>(data->maxSampleCountTableSize))
    {
        THROW (IEX_NAMESPACE::ArgExc, "Bad sampleCountTableDataSize read from chunk "<< lineBlockId << ": expected " << data->maxSampleCountTableSize << " or less, got "<< sampleCountTableDataSize);
    }
    
    Int64 packedDataSize;
    Int64 unpackedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, packedDataSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, unpackedDataSize);

    
    
    //
    // We make a check on the data size requirements here.
    // Whilst we wish to store 64bit sizes on disk, not all the compressors
    // have been made to work with such data sizes and are still limited to
    // using signed 32 bit (int) for the data size. As such, this version
    // insists that we validate that the data size does not exceed the data
    // type max limit.
    // @TODO refactor the compressor code to ensure full 64-bit support.
    //

    int compressorMaxDataSize = std::numeric_limits<int>::max();
    if (sampleCountTableDataSize > Int64(compressorMaxDataSize))
    {
        THROW (IEX_NAMESPACE::ArgExc, "This version of the library does not "
              << "support the allocation of data with size  > "
              << compressorMaxDataSize
              << " file table size    :" << sampleCountTableDataSize << ".\n");
    }
    streamData->is->read(data->sampleCountTableBuffer, sampleCountTableDataSize);
    
    const char* readPtr;

    //
    // If the sample count table is compressed, we'll uncompress it.
    //


    if (sampleCountTableDataSize < static_cast<Int64>(data->maxSampleCountTableSize))
    {
        if(!data->sampleCountTableComp)
        {
            THROW(IEX_NAMESPACE::ArgExc,"Deep scanline data corrupt at chunk " << lineBlockId << " (sampleCountTableDataSize error)");
        }
        data->sampleCountTableComp->uncompress(data->sampleCountTableBuffer,
                                               sampleCountTableDataSize,
                                               minY,
                                               readPtr);
    }
    else readPtr = data->sampleCountTableBuffer;

    char* base = data->sampleCountSliceBase;
    int xStride = data->sampleCountXStride;
    int yStride = data->sampleCountYStride;

    // total number of samples in block: used to check samplecount table doesn't
    // reference more data than exists
    
    size_t cumulative_total_samples=0;
    
    for (int y = minY; y <= maxY; y++)
    {
        int yInDataWindow = y - data->minY;
        data->lineSampleCount[yInDataWindow] = 0;

        int lastAccumulatedCount = 0;
        for (int x = data->minX; x <= data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
            
            // sample count table should always contain monotonically
            // increasing values.
            if (accumulatedCount < lastAccumulatedCount)
            {
                THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at chunk " << lineBlockId << " (negative sample count detected)");
            }

            count = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in both internal and external data structure.
            //

            data->sampleCount[yInDataWindow][x - data->minX] = count;
            data->lineSampleCount[yInDataWindow] += count;
            sampleCount(base, xStride, yStride, x, y) = count;
        }
        cumulative_total_samples+=data->lineSampleCount[yInDataWindow];
        if(cumulative_total_samples*data->combinedSampleSize > unpackedDataSize)
        {
            THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at chunk " << lineBlockId << ": pixel data only contains " << unpackedDataSize 
            << " bytes of data but table references at least " << cumulative_total_samples*data->combinedSampleSize << " bytes of sample data" );            
        }
        data->gotSampleCount[y - data->minY] = true;
    }
}